

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  Curl_easy *data_00;
  CURLcode CVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  size_t insize;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  char *local_48;
  long local_40;
  size_t size;
  
  data = conn->data;
  uVar3 = authstatus->picked;
  if (uVar3 == 1) {
    if (proxy) {
      if (((conn->bits).proxy_user_passwd == true) &&
         (pcVar7 = Curl_checkProxyheaders(conn,"Proxy-authorization"), pcVar7 == (char *)0x0)) {
        local_40 = 0x418;
        lVar2 = 0x180;
        lVar5 = 0x188;
        goto LAB_00111ad5;
      }
LAB_001119cd:
      pcVar7 = (char *)0x0;
    }
    else {
      if (((conn->bits).user_passwd != true) ||
         (pcVar7 = Curl_checkheaders(conn,"Authorization"), pcVar7 != (char *)0x0))
      goto LAB_001119cd;
      local_40 = 0x430;
      lVar2 = 0x210;
      lVar5 = 0x218;
LAB_00111ad5:
      size = 0;
      local_48 = (char *)0x0;
      data_00 = conn->data;
      pcVar7 = curl_maprintf("%s:%s",*(undefined8 *)((conn->chunk).hexbuffer + lVar2 + -0x20),
                             *(undefined8 *)((conn->chunk).hexbuffer + lVar5 + -0x20));
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      insize = strlen(pcVar7);
      CVar1 = Curl_base64_encode(data_00,pcVar7,insize,&local_48,&size);
      lVar2 = local_40;
      if (CVar1 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar1 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -0x20));
          pcVar4 = "";
          if (proxy) {
            pcVar4 = "Proxy-";
          }
          pcVar4 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar4,local_48);
          *(char **)((conn->chunk).hexbuffer + lVar2 + -0x20) = pcVar4;
          (*Curl_cfree)(local_48);
          CVar1 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((conn->chunk).hexbuffer + lVar2 + -0x20) != 0) {
            CVar1 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar7);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar7 = "Basic";
    }
    authstatus->done = true;
  }
  else if (uVar3 == 2) {
    CVar1 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pcVar7 = "Digest";
  }
  else {
    if (uVar3 != 8) {
      pcVar7 = (char *)0x0;
      goto LAB_001119e1;
    }
    CVar1 = Curl_output_ntlm(conn,proxy);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pcVar7 = "NTLM";
  }
  uVar3 = authstatus->picked;
LAB_001119e1:
  if (uVar3 == 0x40) {
    if (((!proxy) && (conn->oauth_bearer != (char *)0x0)) &&
       (pcVar4 = Curl_checkheaders(conn,"Authorization:"), pcVar4 == (char *)0x0)) {
      (*Curl_cfree)((conn->allocptr).userpwd);
      pcVar7 = curl_maprintf("Authorization: Bearer %s\r\n",conn->oauth_bearer);
      (conn->allocptr).userpwd = pcVar7;
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar7 = "Bearer";
    }
    authstatus->done = true;
  }
  if (pcVar7 == (char *)0x0) {
    authstatus->multipass = false;
  }
  else {
    pcVar4 = "Server";
    ppcVar8 = &conn->user;
    if (proxy) {
      pcVar4 = "Proxy";
      ppcVar8 = &(conn->http_proxy).user;
    }
    pcVar6 = "";
    if (*ppcVar8 != (char *)0x0) {
      pcVar6 = *ppcVar8;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar4,pcVar7,pcVar6);
    authstatus->multipass = (_Bool)(authstatus->done ^ 1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && conn->oauth_bearer &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Bearer";
      result = http_output_bearer(conn);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}